

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)16>,false>
          (Thread *this)

{
  byte bVar1;
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  byte *pbVar2;
  unsigned_short *puVar3;
  byte local_31;
  undefined1 auStack_30 [7];
  u8 i;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  for (local_31 = 0; local_31 < 8; local_31 = local_31 + 1) {
    pbVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(result.v + 4),local_31 + 8);
    bVar1 = *pbVar2;
    puVar3 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)auStack_30,local_31);
    *puVar3 = (ushort)bVar1;
  }
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = auStack_30._0_2_;
  value.v[1] = auStack_30._2_2_;
  value.v[2] = auStack_30._4_2_;
  value.v[3] = stack0xffffffffffffffd6;
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}